

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerHLSL::emit_composite_constants(CompilerHLSL *this)

{
  uint uVar1;
  size_t sVar2;
  TypedID<(spirv_cross::Types)0> *pTVar3;
  Variant *pVVar4;
  bool bVar5;
  SPIRConstant *c;
  SPIRType *type;
  undefined1 *extraout_RAX;
  undefined1 *puVar6;
  long lVar7;
  string name;
  LoopLock local_a0;
  ulong local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  ParsedIR::create_loop_hard_lock(&(this->super_CompilerGLSL).super_Compiler.ir);
  sVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[3].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar2 == 0) {
    ParsedIR::LoopLock::~LoopLock(&local_a0);
  }
  else {
    pTVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[3].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar7 = 0;
    local_98 = 0;
    do {
      uVar1 = *(uint *)((long)&pTVar3->id + lVar7);
      pVVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar4[uVar1].type == TypeConstant) {
        c = Variant::get<spirv_cross::SPIRConstant>(pVVar4 + uVar1);
        if (c->specialization == false) {
          type = Variant::get<spirv_cross::SPIRType>
                           ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                            super_VectorView<spirv_cross::Variant>.ptr +
                            *(uint *)&(c->super_IVariant).field_0xc);
          if (*(int *)&(type->super_IVariant).field_0xc == 0xf) {
            bVar5 = Compiler::is_builtin_type((Compiler *)this,type);
            if (bVar5) goto LAB_00261555;
          }
          if ((*(int *)&(type->super_IVariant).field_0xc == 0xf) ||
             ((type->array).super_VectorView<unsigned_int>.buffer_size != 0)) {
            CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,(c->super_IVariant).self.id);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      (local_70,this,(ulong)(c->super_IVariant).self.id,1);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])(&local_90,this,type);
            CompilerGLSL::constant_expression_abi_cxx11_
                      (&local_50,&this->super_CompilerGLSL,c,false,false);
            CompilerGLSL::
            statement<char_const(&)[14],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                      (&this->super_CompilerGLSL,(char (*) [14])"static const ",&local_90,
                       (char (*) [4])0x37d8ee,&local_50,(char (*) [2])0x365574);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p);
            }
            puVar6 = local_60;
            if (local_70[0] != puVar6) {
              operator_delete(local_70[0]);
              puVar6 = extraout_RAX;
            }
            local_98 = CONCAT71((int7)((ulong)puVar6 >> 8),1);
          }
        }
      }
LAB_00261555:
      lVar7 = lVar7 + 4;
    } while (sVar2 << 2 != lVar7);
    ParsedIR::LoopLock::~LoopLock(&local_a0);
    if ((local_98 & 1) != 0) {
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x35b140);
    }
  }
  return;
}

Assistant:

void CompilerHLSL::emit_composite_constants()
{
	// HLSL cannot declare structs or arrays inline, so we must move them out to
	// global constants directly.
	bool emitted = false;

	ir.for_each_typed_id<SPIRConstant>([&](uint32_t, SPIRConstant &c) {
		if (c.specialization)
			return;

		auto &type = this->get<SPIRType>(c.constant_type);

		if (type.basetype == SPIRType::Struct && is_builtin_type(type))
			return;

		if (type.basetype == SPIRType::Struct || !type.array.empty())
		{
			add_resource_name(c.self);
			auto name = to_name(c.self);
			statement("static const ", variable_decl(type, name), " = ", constant_expression(c), ";");
			emitted = true;
		}
	});

	if (emitted)
		statement("");
}